

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1280,unsigned_int>
               (hashfunc<unsigned_int> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  size_type sVar4;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar5;
  uint in_ESI;
  undefined8 in_RDI;
  int in_R8D;
  byte in_R9B;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  bool result;
  uint h;
  keytype k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  uint32_t *in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff12;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff13;
  undefined3 uVar7;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar8;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  pfHash in_stack_ffffffffffffff30;
  Blob<1280> local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [3];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar5 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar5 = "up to";
  }
  _local_8 = in_RDI;
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x500,pcVar5,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12ad6f);
  Blob<1280>::Blob(&local_c8);
  memset(&local_c8,0,0xa0);
  if ((local_d & 1) != 0) {
    hashfunc<unsigned_int>::operator()
              ((hashfunc<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff24,in_ESI),
               (void *)CONCAT44(in_EDX,in_ECX),in_R8D,
               CONCAT13(in_stack_ffffffffffffff13,
                        CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10)),
               in_stack_ffffffffffffff08);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_ESI),
               (value_type_conflict1 *)CONCAT44(in_EDX,in_ECX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1280>,unsigned_int>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
             SUB41((uint)in_stack_ffffffffffffff24 >> 0x18,0),(Blob<1280> *)CONCAT44(in_EDX,in_ECX),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_R8D,CONCAT13(in_stack_ffffffffffffff13,
                                      CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))
                     ));
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28);
  printf("%d keys\n",sVar4 & 0xffffffff);
  uVar2 = _local_8;
  uVar7 = (undefined3)in_stack_ffffffffffffff24;
  bVar6 = 1;
  uVar1 = (ulong)_local_8 >> 0x38;
  bVar3 = TestHashList<unsigned_int>
                    (unaff_retaddr,SUB81(uVar1,0),SUB81((ulong)uVar2 >> 0x30,0),
                     SUB81((ulong)uVar2 >> 0x28,0),SUB81((ulong)uVar2 >> 0x20,0),
                     SUB81((ulong)uVar2 >> 0x18,0));
  uVar8 = CONCAT13(bVar3 & bVar6,uVar7);
  printf("\n");
  bVar6 = (byte)((uint)uVar8 >> 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar8,in_ESI));
  return (bool)(bVar6 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}